

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s-hierarchy-trainer.cc
# Opt level: O2

void __thiscall
RNNLanguageModel<cnn::FastLSTMBuilder>::RNNLanguageModel
          (RNNLanguageModel<cnn::FastLSTMBuilder> *this,Model *model)

{
  uint uVar1;
  LookupParameters *pLVar2;
  Parameters *pPVar3;
  initializer_list<unsigned_int> x;
  initializer_list<unsigned_int> x_00;
  initializer_list<unsigned_int> x_01;
  initializer_list<unsigned_int> x_02;
  initializer_list<unsigned_int> x_03;
  initializer_list<unsigned_int> x_04;
  initializer_list<unsigned_int> x_05;
  initializer_list<unsigned_int> x_06;
  initializer_list<unsigned_int> x_07;
  initializer_list<unsigned_int> x_08;
  initializer_list<unsigned_int> x_09;
  initializer_list<unsigned_int> x_10;
  initializer_list<unsigned_int> x_11;
  initializer_list<unsigned_int> x_12;
  initializer_list<unsigned_int> x_13;
  initializer_list<unsigned_int> x_14;
  initializer_list<unsigned_int> x_15;
  initializer_list<unsigned_int> x_16;
  initializer_list<unsigned_int> x_17;
  initializer_list<unsigned_int> x_18;
  initializer_list<unsigned_int> x_19;
  initializer_list<unsigned_int> x_20;
  uint local_74;
  uint local_70;
  Dim local_6c;
  FastLSTMBuilder *local_48;
  FastLSTMBuilder *local_40;
  FastLSTMBuilder *local_38;
  
  local_38 = &this->l2rbuilder;
  cnn::FastLSTMBuilder::FastLSTMBuilder(local_38,LAYERS + 1,INPUT_WINDOWS_DIM,HIDDEN_DIM,model);
  cnn::FastLSTMBuilder::FastLSTMBuilder
            (&this->r2lbuilder,LAYERS + 1,INPUT_WINDOWS_DIM,HIDDEN_DIM,model);
  local_40 = &this->r2lbuilder;
  cnn::FastLSTMBuilder::FastLSTMBuilder(&this->orderbuilder,LAYERS,HIDDEN_DIM * 4,HIDDEN_DIM,model);
  uVar1 = VOCAB_SIZE;
  local_74 = WORD_DIM;
  x._M_len = 1;
  x._M_array = &local_74;
  local_48 = &this->orderbuilder;
  cnn::Dim::Dim(&local_6c,x);
  pLVar2 = cnn::Model::add_lookup_parameters(model,uVar1,&local_6c,0.0);
  this->p_w = pLVar2;
  uVar1 = CHAR_SIZE;
  local_74 = CHAR_DIM;
  x_00._M_len = 1;
  x_00._M_array = &local_74;
  cnn::Dim::Dim(&local_6c,x_00);
  pLVar2 = cnn::Model::add_lookup_parameters(model,uVar1,&local_6c,0.0);
  this->p_c = pLVar2;
  local_74 = INPUT_DIM;
  x_01._M_len = 1;
  x_01._M_array = &local_74;
  cnn::Dim::Dim(&local_6c,x_01);
  pPVar3 = cnn::Model::add_parameters(model,&local_6c,0.0);
  this->p_wordpadding_2 = pPVar3;
  local_74 = INPUT_DIM;
  x_02._M_len = 1;
  x_02._M_array = &local_74;
  cnn::Dim::Dim(&local_6c,x_02);
  pPVar3 = cnn::Model::add_parameters(model,&local_6c,0.0);
  this->p_wordpadding_1 = pPVar3;
  local_74 = INPUT_DIM;
  x_03._M_len = 1;
  x_03._M_array = &local_74;
  cnn::Dim::Dim(&local_6c,x_03);
  pPVar3 = cnn::Model::add_parameters(model,&local_6c,0.0);
  this->p_wordpadding2 = pPVar3;
  local_74 = INPUT_DIM;
  x_04._M_len = 1;
  x_04._M_array = &local_74;
  cnn::Dim::Dim(&local_6c,x_04);
  pPVar3 = cnn::Model::add_parameters(model,&local_6c,0.0);
  this->p_wordpadding1 = pPVar3;
  local_74 = CHAR_DIM;
  x_05._M_len = 1;
  x_05._M_array = &local_74;
  cnn::Dim::Dim(&local_6c,x_05);
  pPVar3 = cnn::Model::add_parameters(model,&local_6c,0.0);
  this->p_charpadding_2 = pPVar3;
  local_74 = CHAR_DIM;
  x_06._M_len = 1;
  x_06._M_array = &local_74;
  cnn::Dim::Dim(&local_6c,x_06);
  pPVar3 = cnn::Model::add_parameters(model,&local_6c,0.0);
  this->p_charpadding_1 = pPVar3;
  local_74 = CHAR_DIM;
  x_07._M_len = 1;
  x_07._M_array = &local_74;
  cnn::Dim::Dim(&local_6c,x_07);
  pPVar3 = cnn::Model::add_parameters(model,&local_6c,0.0);
  this->p_charpadding2 = pPVar3;
  local_74 = CHAR_DIM;
  x_08._M_len = 1;
  x_08._M_array = &local_74;
  cnn::Dim::Dim(&local_6c,x_08);
  pPVar3 = cnn::Model::add_parameters(model,&local_6c,0.0);
  this->p_charpadding1 = pPVar3;
  local_74 = CHAR_HIDDEN_DIM;
  local_70 = (CHAR_WINDOWS * 2 + 1) * CHAR_DIM;
  x_09._M_len = 2;
  x_09._M_array = &local_74;
  cnn::Dim::Dim(&local_6c,x_09);
  pPVar3 = cnn::Model::add_parameters(model,&local_6c,0.0);
  this->p_charw2charh = pPVar3;
  local_74 = CHAR_HIDDEN_DIM;
  x_10._M_len = 1;
  x_10._M_array = &local_74;
  cnn::Dim::Dim(&local_6c,x_10);
  pPVar3 = cnn::Model::add_parameters(model,&local_6c,0.0);
  this->p_charhbias = pPVar3;
  local_74 = CHAR_HIDDEN_DIM;
  local_70 = CHAR_HIDDEN_DIM;
  x_11._M_len = 2;
  x_11._M_array = &local_74;
  cnn::Dim::Dim(&local_6c,x_11);
  pPVar3 = cnn::Model::add_parameters(model,&local_6c,0.0);
  this->p_charh2xMExp = pPVar3;
  local_74 = CHAR_HIDDEN_DIM;
  local_70 = WORD_DIM;
  x_12._M_len = 2;
  x_12._M_array = &local_74;
  cnn::Dim::Dim(&local_6c,x_12);
  pPVar3 = cnn::Model::add_parameters(model,&local_6c,0.0);
  this->p_word2xMExp = pPVar3;
  local_74 = CHAR_HIDDEN_DIM;
  x_13._M_len = 1;
  x_13._M_array = &local_74;
  cnn::Dim::Dim(&local_6c,x_13);
  pPVar3 = cnn::Model::add_parameters(model,&local_6c,0.0);
  this->p_xMExpbias = pPVar3;
  local_74 = CHAR_HIDDEN_DIM;
  local_70 = CHAR_HIDDEN_DIM;
  x_14._M_len = 2;
  x_14._M_array = &local_74;
  cnn::Dim::Dim(&local_6c,x_14);
  pPVar3 = cnn::Model::add_parameters(model,&local_6c,0.0);
  this->p_xMExp2xExp = pPVar3;
  local_74 = HIDDEN_DIM;
  local_70 = HIDDEN_DIM * 2;
  x_15._M_len = 2;
  x_15._M_array = &local_74;
  cnn::Dim::Dim(&local_6c,x_15);
  pPVar3 = cnn::Model::add_parameters(model,&local_6c,0.0);
  this->p_oh2ohxMExp = pPVar3;
  local_74 = HIDDEN_DIM;
  local_70 = HIDDEN_DIM;
  x_16._M_len = 2;
  x_16._M_array = &local_74;
  cnn::Dim::Dim(&local_6c,x_16);
  pPVar3 = cnn::Model::add_parameters(model,&local_6c,0.0);
  this->p_osh2ohxMExp = pPVar3;
  local_74 = 1;
  local_70 = HIDDEN_DIM;
  x_17._M_len = 2;
  x_17._M_array = &local_74;
  cnn::Dim::Dim(&local_6c,x_17);
  pPVar3 = cnn::Model::add_parameters(model,&local_6c,0.0);
  this->p_u = pPVar3;
  local_74 = LABEL_HIDDEN_DIM;
  local_70 = HIDDEN_DIM;
  x_18._M_len = 2;
  x_18._M_array = &local_74;
  cnn::Dim::Dim(&local_6c,x_18);
  pPVar3 = cnn::Model::add_parameters(model,&local_6c,0.0);
  this->p_oh2lh = pPVar3;
  local_74 = LABEL_HIDDEN_DIM;
  x_19._M_len = 1;
  x_19._M_array = &local_74;
  cnn::Dim::Dim(&local_6c,x_19);
  pPVar3 = cnn::Model::add_parameters(model,&local_6c,0.0);
  this->p_lhbias = pPVar3;
  local_74 = LABEL_SIZE;
  local_70 = LABEL_HIDDEN_DIM;
  x_20._M_len = 2;
  x_20._M_array = &local_74;
  cnn::Dim::Dim(&local_6c,x_20);
  pPVar3 = cnn::Model::add_parameters(model,&local_6c,0.0);
  this->p_lh2l = pPVar3;
  return;
}

Assistant:

explicit RNNLanguageModel(Model& model) :
      l2rbuilder(LAYERS+1, INPUT_WINDOWS_DIM, HIDDEN_DIM, &model),
      r2lbuilder(LAYERS+1, INPUT_WINDOWS_DIM, HIDDEN_DIM, &model),
      orderbuilder(LAYERS, HIDDEN_DIM*4, HIDDEN_DIM, &model){

    p_w = model.add_lookup_parameters(VOCAB_SIZE, {WORD_DIM}); 
    p_c = model.add_lookup_parameters(CHAR_SIZE, {CHAR_DIM});
    
    p_wordpadding_2 = model.add_parameters({INPUT_DIM});
    p_wordpadding_1 = model.add_parameters({INPUT_DIM});
    p_wordpadding2 = model.add_parameters({INPUT_DIM});
    p_wordpadding1 = model.add_parameters({INPUT_DIM});

    p_charpadding_2 = model.add_parameters({CHAR_DIM});
    p_charpadding_1 = model.add_parameters({CHAR_DIM});
    p_charpadding2 = model.add_parameters({CHAR_DIM});
    p_charpadding1 = model.add_parameters({CHAR_DIM});

    p_charw2charh = model.add_parameters({CHAR_HIDDEN_DIM, CHAR_DIM*(CHAR_WINDOWS*2+1)});
    p_charhbias = model.add_parameters({CHAR_HIDDEN_DIM});

    //attention pooling
    p_charh2xMExp = model.add_parameters({CHAR_HIDDEN_DIM, CHAR_HIDDEN_DIM});
    p_word2xMExp = model.add_parameters({CHAR_HIDDEN_DIM, WORD_DIM});
    p_xMExpbias = model.add_parameters({CHAR_HIDDEN_DIM});
    p_xMExp2xExp = model.add_parameters({CHAR_HIDDEN_DIM, CHAR_HIDDEN_DIM});
    //

    // p_l2oh = model.add_parameters({HIDDEN_DIM, HIDDEN_DIM});
    // p_r2oh = model.add_parameters({HIDDEN_DIM, HIDDEN_DIM});
    // p_ohbias = model.add_parameters({HIDDEN_DIM});

    //attention labelling
    p_oh2ohxMExp = model.add_parameters({HIDDEN_DIM, HIDDEN_DIM*2});
    p_osh2ohxMExp = model.add_parameters({HIDDEN_DIM, HIDDEN_DIM});
    p_u = model.add_parameters({1,HIDDEN_DIM});

    p_oh2lh = model.add_parameters({LABEL_HIDDEN_DIM,HIDDEN_DIM});
    p_lhbias = model.add_parameters({LABEL_HIDDEN_DIM});

    p_lh2l = model.add_parameters({LABEL_SIZE, LABEL_HIDDEN_DIM});
  }